

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix4 * matrix4_invert(matrix4 *self)

{
  matrix4 *pmVar1;
  long lVar2;
  matrix4 inverse;
  matrix4 local_88;
  
  pmVar1 = matrix4_inverse(self,&local_88);
  if (pmVar1 != (matrix4 *)0x0) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      (self->field_0).m[lVar2] = local_88.field_0.m[lVar2];
    }
  }
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_invert(struct matrix4 *self)
{
	struct matrix4 inverse;
	uint8_t i;

	if (matrix4_inverse(self, &inverse)) {
		for (i = 0; i < 16; i++) {
			self->m[i] = inverse.m[i];
		}
	}

	return self;
}